

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O3

void __thiscall
StatusPrinter::BuildEdgeFinished
          (StatusPrinter *this,Edge *edge,int64_t end_time_millis,bool success,string *output)

{
  LinePrinter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  size_type *psVar5;
  pointer ppNVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string outputs;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40;
  StatusPrinter *local_38;
  
  this->time_millis_ = end_time_millis;
  this->finished_edges_ = this->finished_edges_ + 1;
  bVar3 = Edge::use_console(edge);
  if (bVar3) {
    LinePrinter::SetConsoleLocked(&this->printer_,false);
  }
  if (*(int *)this->config_ != 0) {
    bVar3 = Edge::use_console(edge);
    if (!bVar3) {
      PrintStatus(this,edge,end_time_millis);
    }
    this->running_edges_ = this->running_edges_ + -1;
    if (!success) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      ppNVar6 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_40 = output;
      local_38 = this;
      if (ppNVar6 !=
          (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          pcVar2 = ((*ppNVar6)->path_)._M_dataplus._M_p;
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,pcVar2,pcVar2 + ((*ppNVar6)->path_)._M_string_length);
          std::__cxx11::string::append((char *)&local_a0);
          std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_a0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          ppNVar6 = ppNVar6 + 1;
        } while (ppNVar6 !=
                 (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      this = local_38;
      this_00 = &local_38->printer_;
      if ((local_38->printer_).supports_color_ == false) {
        std::operator+(&local_80,"FAILED: ",&local_60);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_a0.field_2._M_allocated_capacity = *psVar5;
          local_a0.field_2._8_8_ = plVar4[3];
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar5;
          local_a0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_a0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        LinePrinter::PrintOnNewLine(this_00,&local_a0);
      }
      else {
        std::operator+(&local_80,"\x1b[31mFAILED: \x1b[0m",&local_60);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_a0.field_2._M_allocated_capacity = *psVar5;
          local_a0.field_2._8_8_ = plVar4[3];
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar5;
          local_a0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_a0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        LinePrinter::PrintOnNewLine(this_00,&local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      Edge::EvaluateCommand_abi_cxx11_(&local_80,edge,false);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_a0.field_2._M_allocated_capacity = *psVar5;
        local_a0.field_2._8_8_ = plVar4[3];
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar5;
        local_a0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_a0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      LinePrinter::PrintOnNewLine(this_00,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      output = local_40;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
    }
    if (output->_M_string_length != 0) {
      paVar1 = &local_60.field_2;
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      local_60._M_dataplus._M_p = (pointer)paVar1;
      if ((this->printer_).supports_color_ == false) {
        StripAnsiEscapeCodes(&local_a0,output);
        std::__cxx11::string::operator=((string *)&local_60,(string *)&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_60);
      }
      LinePrinter::PrintOnNewLine(&this->printer_,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  return;
}

Assistant:

void StatusPrinter::BuildEdgeFinished(Edge* edge, int64_t end_time_millis,
                                      bool success, const string& output) {
  time_millis_ = end_time_millis;
  ++finished_edges_;

  if (edge->use_console())
    printer_.SetConsoleLocked(false);

  if (config_.verbosity == BuildConfig::QUIET)
    return;

  if (!edge->use_console())
    PrintStatus(edge, end_time_millis);

  --running_edges_;

  // Print the command that is spewing before printing its output.
  if (!success) {
    string outputs;
    for (vector<Node*>::const_iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o)
      outputs += (*o)->path() + " ";

    if (printer_.supports_color()) {
        printer_.PrintOnNewLine("\x1B[31m" "FAILED: " "\x1B[0m" + outputs + "\n");
    } else {
        printer_.PrintOnNewLine("FAILED: " + outputs + "\n");
    }
    printer_.PrintOnNewLine(edge->EvaluateCommand() + "\n");
  }

  if (!output.empty()) {
    // ninja sets stdout and stderr of subprocesses to a pipe, to be able to
    // check if the output is empty. Some compilers, e.g. clang, check
    // isatty(stderr) to decide if they should print colored output.
    // To make it possible to use colored output with ninja, subprocesses should
    // be run with a flag that forces them to always print color escape codes.
    // To make sure these escape codes don't show up in a file if ninja's output
    // is piped to a file, ninja strips ansi escape codes again if it's not
    // writing to a |smart_terminal_|.
    // (Launching subprocesses in pseudo ttys doesn't work because there are
    // only a few hundred available on some systems, and ninja can launch
    // thousands of parallel compile commands.)
    string final_output;
    if (!printer_.supports_color())
      final_output = StripAnsiEscapeCodes(output);
    else
      final_output = output;

#ifdef _WIN32
    // Fix extra CR being added on Windows, writing out CR CR LF (#773)
    _setmode(_fileno(stdout), _O_BINARY);  // Begin Windows extra CR fix
#endif

    printer_.PrintOnNewLine(final_output);

#ifdef _WIN32
    _setmode(_fileno(stdout), _O_TEXT);  // End Windows extra CR fix
#endif
  }
}